

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void memory_region_transaction_commit_riscv64(MemoryRegion_conflict *mr)

{
  MemoryRegion_conflict *mr_00;
  gpointer pvVar1;
  uc_struct_conflict12 *puVar2;
  MemoryListener *pMVar3;
  AddressSpace *pAVar4;
  
  puVar2 = mr->uc;
  if (puVar2->memory_region_update_pending == true) {
    if (puVar2->flat_views != (GHashTable *)0x0) {
      g_hash_table_destroy(puVar2->flat_views);
      puVar2->flat_views = (GHashTable *)0x0;
    }
    flatviews_init((uc_struct_conflict13 *)puVar2);
    for (pAVar4 = (puVar2->address_spaces).tqh_first; pAVar4 != (AddressSpace *)0x0;
        pAVar4 = (pAVar4->address_spaces_link).tqe_next) {
      mr_00 = memory_region_get_flatview_root(pAVar4->root);
      pvVar1 = g_hash_table_lookup(puVar2->flat_views,mr_00);
      if (pvVar1 == (gpointer)0x0) {
        generate_memory_topology((uc_struct_conflict13 *)puVar2,mr_00);
      }
    }
    puVar2 = mr->uc;
    pMVar3 = (puVar2->memory_listeners).tqh_first;
    if (pMVar3 != (MemoryListener *)0x0) {
      do {
        if (pMVar3->begin != (_func_void_MemoryListener_ptr *)0x0) {
          (*pMVar3->begin)(pMVar3);
        }
        pMVar3 = (pMVar3->link).tqe_next;
      } while (pMVar3 != (MemoryListener *)0x0);
      puVar2 = mr->uc;
    }
    pAVar4 = (puVar2->address_spaces).tqh_first;
    if (pAVar4 != (AddressSpace *)0x0) {
      do {
        address_space_set_flatview(pAVar4);
        pAVar4 = (pAVar4->address_spaces_link).tqe_next;
      } while (pAVar4 != (AddressSpace *)0x0);
      puVar2 = mr->uc;
    }
    puVar2->memory_region_update_pending = false;
    for (pMVar3 = (puVar2->memory_listeners).tqh_first; pMVar3 != (MemoryListener *)0x0;
        pMVar3 = (pMVar3->link).tqe_next) {
      if (pMVar3->commit != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar3->commit)(pMVar3);
      }
    }
  }
  return;
}

Assistant:

void memory_region_transaction_commit(MemoryRegion *mr)
{
    AddressSpace *as;

    if (mr->uc->memory_region_update_pending) {
        flatviews_reset(mr->uc);

        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, begin, Forward);

        QTAILQ_FOREACH(as, &mr->uc->address_spaces, address_spaces_link) {
            address_space_set_flatview(as);
        }
        mr->uc->memory_region_update_pending = false;
        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, commit, Forward);
    }
}